

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O1

scanner * lightconf::config_format::make_scanner(scanner *__return_storage_ptr__,string *input)

{
  _Any_data _Stack_38;
  code *local_28;
  undefined4 local_18;
  
  (__return_storage_ptr__->input_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->input_).field_2;
  (__return_storage_ptr__->input_)._M_string_length = 0;
  (__return_storage_ptr__->input_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tokens_).
  super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tokens_).
  super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->tokens_).
           super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->tokens_).
           super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  __return_storage_ptr__->eof_ = true;
  __return_storage_ptr__->pos_ = 0;
  __return_storage_ptr__->line_ = 1;
  __return_storage_ptr__->col_ = 1;
  *(undefined8 *)&(__return_storage_ptr__->params_).comment_function.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->params_).comment_function.super__Function_base._M_functor + 8) =
       0;
  (__return_storage_ptr__->params_).comment_function.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (__return_storage_ptr__->params_).comment_function._M_invoker = (_Invoker_type)0x0;
  (__return_storage_ptr__->params_).flags = 0;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_38,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)default_scanner_params);
  local_18 = default_scanner_params._32_4_;
  scanner::scan(__return_storage_ptr__,input,(scanner_params *)&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

inline scanner make_scanner(const std::string& input) {
    scanner sc;
    sc.scan(input);
    return sc;
}